

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<QGraphicsItem_*>::swapItemsAt(QList<QGraphicsItem_*> *this,qsizetype i,qsizetype j)

{
  Data *pDVar1;
  QGraphicsItem **ppQVar2;
  QGraphicsItem *pQVar3;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QGraphicsItem_*>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QGraphicsItem_*> *)0x0);
  }
  ppQVar2 = (this->d).ptr;
  pQVar3 = ppQVar2[i];
  ppQVar2[i] = ppQVar2[j];
  ppQVar2[j] = pQVar3;
  return;
}

Assistant:

void swapItemsAt(qsizetype i, qsizetype j) {
        Q_ASSERT_X(i >= 0 && i < size() && j >= 0 && j < size(),
                    "QList<T>::swap", "index out of range");
        detach();
        qSwap(d->begin()[i], d->begin()[j]);
    }